

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O1

int lib::math::Log(State *state)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  StackAPI api;
  double local_20;
  StackAPI local_18;
  
  luna::StackAPI::StackAPI(&local_18,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (&local_18,1,ValueT_Number,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    dVar3 = luna::StackAPI::GetNumber(&local_18,0);
    local_20 = log(dVar3);
    iVar2 = luna::StackAPI::GetStackSize(&local_18);
    if (1 < iVar2) {
      dVar3 = luna::StackAPI::GetNumber(&local_18,1);
      dVar3 = log(dVar3);
      local_20 = local_20 / dVar3;
    }
    luna::StackAPI::PushNumber(&local_18,local_20);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Log(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto l = std::log(api.GetNumber(0));
        if (api.GetStackSize() > 1)
        {
            auto b = std::log(api.GetNumber(1));
            l /= b;
        }

        api.PushNumber(l);
        return 1;
    }